

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O2

void __thiscall QToolBarExtension::paintEvent(QToolBarExtension *this,QPaintEvent *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 *local_d8;
  QWidget *pQStack_d0;
  QStyle *local_c8;
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_d0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_d8,(QWidget *)this);
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)this + 0x1b8))(this,&opt);
  opt.features.super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
  super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i._0_1_ =
       (byte)opt.features.super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
             super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i & 0xef;
  QStylePainter::drawComplexControl
            ((QStylePainter *)&local_d8,CC_ToolButton,&opt.super_QStyleOptionComplex);
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  QPainter::~QPainter((QPainter *)&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarExtension::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    // We do not need to draw both extension arrows
    opt.features &= ~QStyleOptionToolButton::HasMenu;
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}